

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O1

void advance_level(CHAR_DATA *ch,bool hide)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  PC_DATA *pPVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  CClass *pCVar12;
  char *pcVar13;
  char *pcVar14;
  short *psVar15;
  long lVar16;
  short sVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  char buf [4608];
  
  bVar6 = is_npc(ch);
  if (!bVar6) {
    ch->pcdata->last_level = (((int)current_time - (int)ch->logon) + ch->played) / 0xe10;
    pCVar12 = ch->my_class;
    if ((pCVar12 == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (pCVar12 = ch->pIndexData->my_class, pCVar12 == (CClass *)0x0)))) {
      pCVar12 = CClass::GetClass(0);
    }
    iVar7 = CClass::GetIndex(pCVar12);
    sprintf(buf,"the %s",title_table[iVar7][ch->level][ch->sex == 2]);
    set_title(ch,buf);
    get_curr_stat(ch,1);
    get_curr_stat(ch,2);
    iVar7 = get_curr_stat(ch,4);
    iVar8 = get_curr_stat(ch,3);
    iVar9 = get_curr_stat(ch,4);
    iVar10 = get_curr_stat(ch,3);
    uVar11 = number_range((iVar8 + iVar7) / 5,(iVar10 + iVar9) / 3);
    iVar7 = get_curr_stat(ch,2);
    sVar1 = wis_app[iVar7].practice;
    iVar7 = get_curr_stat(ch,4);
    pCVar12 = ch->my_class;
    if ((pCVar12 == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (pCVar12 = ch->pIndexData->my_class, pCVar12 == (CClass *)0x0)))) {
      pCVar12 = CClass::GetClass(0);
    }
    iVar8 = pCVar12->gainconst;
    iVar9 = number_range(-1,2);
    uVar19 = (uint)((double)iVar9 + (double)iVar8 * 1.3333 + (double)iVar7 * 0.5333 + -1.3333);
    iVar7 = get_curr_stat(ch,4);
    if (0x17 < iVar7) {
      iVar7 = get_curr_stat(ch,4);
      uVar19 = (uVar19 + iVar7) - 0x17;
    }
    iVar7 = get_curr_stat(ch,1);
    pCVar12 = ch->my_class;
    if ((pCVar12 == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (pCVar12 = ch->pIndexData->my_class, pCVar12 == (CClass *)0x0)))) {
      pCVar12 = CClass::GetClass(0);
    }
    iVar8 = pCVar12->gainconst;
    iVar9 = number_range(-1,2);
    pCVar12 = ch->my_class;
    if ((pCVar12 == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (pCVar12 = ch->pIndexData->my_class, pCVar12 == (CClass *)0x0)))) {
      pCVar12 = CClass::GetClass(0);
    }
    iVar10 = CClass::GetIndex(pCVar12);
    if (iVar10 == 1) {
      iVar10 = number_percent();
      uVar19 = uVar19 + (0x4b < iVar10);
    }
    pCVar12 = ch->my_class;
    if ((pCVar12 == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (pCVar12 = ch->pIndexData->my_class, pCVar12 == (CClass *)0x0)))) {
      pCVar12 = CClass::GetClass(0);
    }
    uVar18 = (uint)((double)iVar8 * -2.0833 + (double)iVar7 * 0.5667 + 8.0278 + (double)iVar9);
    iVar7 = CClass::GetIndex(pCVar12);
    if (iVar7 == 10) {
      iVar7 = number_range(2,5);
      uVar18 = uVar18 - iVar7;
    }
    pCVar12 = ch->my_class;
    if ((pCVar12 == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (pCVar12 = ch->pIndexData->my_class, pCVar12 == (CClass *)0x0)))) {
      pCVar12 = CClass::GetClass(0);
    }
    iVar7 = CClass::GetIndex(pCVar12);
    if (iVar7 == 0xb) {
      iVar7 = number_range(1,2);
      uVar18 = uVar18 - iVar7;
    }
    uVar20 = 6;
    if (6 < (int)uVar11) {
      uVar20 = (ulong)uVar11;
    }
    ch->max_hit = ch->max_hit + (short)uVar19;
    ch->max_mana = ch->max_mana + (short)uVar18;
    ch->max_move = ch->max_move + (short)uVar20;
    ch->practice = ch->practice + sVar1;
    if (ch->level * -0x33333333 + 0x19999999U < 0x33333333) {
      ch->train = ch->train + 1;
    }
    pCVar12 = ch->my_class;
    if ((pCVar12 == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (pCVar12 = ch->pIndexData->my_class, pCVar12 == (CClass *)0x0)))) {
      pCVar12 = CClass::GetClass(0);
    }
    iVar7 = CClass::GetIndex(pCVar12);
    if ((iVar7 == 1) &&
       ((ch->level * -0x33333333 + 0x19999998U >> 2 | ch->level * 0x40000000) < 0xccccccd)) {
      psVar15 = &ch->pcdata->special;
      *psVar15 = *psVar15 + 1;
    }
    pPVar5 = ch->pcdata;
    pPVar5->perm_hit = pPVar5->perm_hit + (short)uVar19;
    pPVar5->perm_mana = pPVar5->perm_mana + (short)uVar18;
    pPVar5->perm_move = pPVar5->perm_move + (short)uVar20;
    psVar15 = &skill_table[0].ctype;
    lVar16 = 0;
    do {
      if ((10 < pPVar5->learned[lVar16]) && (*psVar15 != 3)) {
        sVar17 = pPVar5->learned[lVar16] + 1;
        if (99 < sVar17) {
          sVar17 = 100;
        }
        pPVar5->learned[lVar16] = sVar17;
      }
      lVar16 = lVar16 + 1;
      psVar15 = psVar15 + 0x30;
    } while (lVar16 != 800);
    lVar16 = 0x16;
    do {
      pPVar5 = (&ch->pcdata->next)[lVar16];
      if ((pPVar5 != (PC_DATA *)0x0) && (*(char *)&pPVar5->next != '\0')) {
        free_pstring((char *)pPVar5);
        (&ch->pcdata->next)[lVar16] = (PC_DATA *)0x0;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x7a);
    if (!hide) {
      pcVar13 = get_char_color(ch,"lightgreen");
      sVar17 = ch->max_hit;
      sVar2 = ch->max_mana;
      sVar3 = ch->max_move;
      sVar4 = ch->practice;
      pcVar14 = END_COLOR(ch);
      sprintf(buf,"%sYou gain %d/%d hp, %d/%d mana, %d/%d move, and %d/%d practices.%s\n\r",pcVar13,
              (ulong)uVar19,(ulong)(uint)(int)sVar17,(ulong)uVar18,(ulong)(uint)(int)sVar2,uVar20,
              (ulong)(uint)(int)sVar3,(ulong)(uint)(int)sVar1,(ulong)(uint)(int)sVar4,pcVar14);
      send_to_char(buf,ch);
    }
    save_char_obj(ch);
  }
  return;
}

Assistant:

void advance_level(CHAR_DATA *ch, bool hide)
{
	char buf[MAX_STRING_LENGTH];
	float tmp;
	int add_hp;
	int add_mana;
	int add_move;
	int add_prac;
	int int_mod;
	int sn;
	int i;
	int wis_mod;

	if (is_npc(ch))
		return;

	ch->pcdata->last_level = (ch->played + (int)(current_time - ch->logon)) / 3600;

	sprintf(buf, "the %s", title_table[ch->Class()->GetIndex()][ch->level][ch->sex == SEX_FEMALE ? 1 : 0]);
	set_title(ch, buf);

	int_mod = get_curr_stat(ch, STAT_INT) - 2;
	wis_mod = get_curr_stat(ch, STAT_WIS) - 2;
	add_move = number_range(
		(get_curr_stat(ch, STAT_CON) + get_curr_stat(ch, STAT_DEX)) / 5,
		(get_curr_stat(ch, STAT_CON) + get_curr_stat(ch, STAT_DEX)) / 3);
	add_prac = wis_app[get_curr_stat(ch, STAT_WIS)].practice;

	tmp = -1.3333 + .5333 * get_curr_stat(ch, STAT_CON) + 1.3333 * ch->Class()->gainconst + number_range(-1, 2);
	add_hp = (int)tmp;

	if (get_curr_stat(ch, STAT_CON) >= 24)
		add_hp += get_curr_stat(ch, STAT_CON) - 23;

	tmp = 8.0278 + 0.5667 * get_curr_stat(ch, STAT_INT) - 2.0833 * ch->Class()->gainconst + number_range(-1, 2);
	add_mana = (int)tmp;

	if (ch->Class()->GetIndex() == CLASS_WARRIOR && number_percent() > 75)
		add_hp += 1;

	if (ch->Class()->GetIndex() == CLASS_NECROMANCER)
		add_mana -= number_range(2, 5);

	if (ch->Class()->GetIndex() == CLASS_SORCERER)
		add_mana -= number_range(1, 2);

	add_move = std::max(6, add_move);

	ch->max_hit += add_hp;
	ch->max_mana += add_mana;
	ch->max_move += add_move;
	ch->practice += add_prac;

	if (ch->level % 5 == 0)
		ch->train += 1;

	if (ch->Class()->GetIndex() == CLASS_WARRIOR && ch->level % 20 == 0)
		ch->pcdata->special++;

	ch->pcdata->perm_hit += add_hp;
	ch->pcdata->perm_mana += add_mana;
	ch->pcdata->perm_move += add_move;

	for (sn = 0; sn < MAX_SKILL; sn++)
	{
		if (ch->pcdata->learned[sn] > 10 && skill_table[sn].ctype != CMD_POWER)
		{
			ch->pcdata->learned[sn]++;
			ch->pcdata->learned[sn] = std::min((int)ch->pcdata->learned[sn], 100);
		}
	}

	for (i = 0; i < 100; i++)
	{
		if (ch->pcdata->recentkills[i]
			&& ch->pcdata->recentkills[i][0] != '\0'
			&& strcmp(ch->pcdata->recentkills[i], ""))
		{
			free_pstring(ch->pcdata->recentkills[i]);
			ch->pcdata->recentkills[i] = nullptr;
		}
	}

	if (!hide)
	{
		sprintf(buf, "%sYou gain %d/%d hp, %d/%d mana, %d/%d move, and %d/%d practices.%s\n\r",
			get_char_color(ch, "lightgreen"),
			add_hp,
			ch->max_hit,
			add_mana,
			ch->max_mana,
			add_move,
			ch->max_move,
			add_prac,
			ch->practice,
			END_COLOR(ch));
		send_to_char(buf, ch);
	}

	save_char_obj(ch);
}